

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O2

void __thiscall duckdb_shell::ModeBoxRenderer::print_box_line(ModeBoxRenderer *this,idx_t N)

{
  bool bVar1;
  string box_line;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  while (bVar1 = N != 0, N = N - 1, bVar1) {
    std::__cxx11::string::append((char *)&local_40);
  }
  ShellState::Print((this->super_ColumnRenderer).super_ShellRenderer.state,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void print_box_line(idx_t N) {
		string box_line;
		for (idx_t i = 0; i < N; i++) {
			box_line += BOX_24;
		}
		state.Print(box_line);
	}